

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall btQuantizedBvh::buildTree(btQuantizedBvh *this,int startIndex,int endIndex)

{
  btQuantizedBvhNode *pbVar1;
  btOptimizedBvhNode *pbVar2;
  btScalar *pbVar3;
  btOptimizedBvhNode *pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  int iVar10;
  int endIndex_00;
  btOptimizedBvhNode *pbVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  btScalar bVar17;
  btScalar bVar18;
  btScalar bVar19;
  btScalar bVar20;
  btVector3 local_50;
  btVector3 local_40;
  
  iVar15 = this->m_curNodeIndex;
  lVar13 = (long)iVar15;
  if (endIndex - startIndex == 1) {
    if (this->m_useQuantization == true) {
      pbVar11 = (btOptimizedBvhNode *)(this->m_quantizedContiguousNodes).m_data;
      lVar14 = lVar13 << 4;
      pbVar1 = (this->m_quantizedLeafNodes).m_data + startIndex;
      bVar17 = *(btScalar *)pbVar1->m_quantizedAabbMin;
      bVar18 = *(btScalar *)(pbVar1->m_quantizedAabbMin + 2);
      bVar19 = *(btScalar *)(pbVar1->m_quantizedAabbMax + 1);
      bVar20 = (btScalar)pbVar1->m_escapeIndexOrTriangleIndex;
    }
    else {
      pbVar4 = (this->m_leafNodes).m_data;
      pbVar11 = (this->m_contiguousNodes).m_data;
      lVar14 = lVar13 * 0x40;
      pbVar2 = pbVar4 + startIndex;
      bVar17 = (pbVar2->m_aabbMinOrg).m_floats[0];
      bVar18 = (pbVar2->m_aabbMinOrg).m_floats[1];
      bVar19 = (pbVar2->m_aabbMinOrg).m_floats[2];
      bVar20 = (pbVar2->m_aabbMinOrg).m_floats[3];
      uVar5 = *(undefined8 *)pbVar4[startIndex].m_aabbMaxOrg.m_floats;
      uVar6 = *(undefined8 *)(pbVar4[startIndex].m_aabbMaxOrg.m_floats + 2);
      pbVar2 = pbVar4 + startIndex;
      iVar15 = pbVar2->m_escapeIndex;
      iVar10 = pbVar2->m_subPart;
      uVar7 = *(undefined8 *)(&pbVar2->m_escapeIndex + 2);
      uVar8 = *(undefined8 *)(pbVar4[startIndex].m_padding + 4 + 8);
      *(undefined8 *)(pbVar11[lVar13].m_padding + 4) =
           *(undefined8 *)(pbVar4[startIndex].m_padding + 4);
      *(undefined8 *)(pbVar11[lVar13].m_padding + 0xc) = uVar8;
      pbVar2 = pbVar11 + lVar13;
      pbVar2->m_escapeIndex = iVar15;
      pbVar2->m_subPart = iVar10;
      *(undefined8 *)(&pbVar2->m_escapeIndex + 2) = uVar7;
      *(undefined8 *)pbVar11[lVar13].m_aabbMaxOrg.m_floats = uVar5;
      *(undefined8 *)(pbVar11[lVar13].m_aabbMaxOrg.m_floats + 2) = uVar6;
    }
    pbVar3 = (btScalar *)((long)(pbVar11->m_aabbMinOrg).m_floats + lVar14);
    *pbVar3 = bVar17;
    pbVar3[1] = bVar18;
    pbVar3[2] = bVar19;
    pbVar3[3] = bVar20;
    this->m_curNodeIndex = this->m_curNodeIndex + 1;
  }
  else {
    iVar10 = calcSplittingAxis(this,startIndex,endIndex);
    endIndex_00 = sortAndCalcSplittingIndex(this,startIndex,endIndex,iVar10);
    iVar10 = this->m_curNodeIndex;
    setInternalNodeAabbMin(this,iVar10,&this->m_bvhAabbMax);
    setInternalNodeAabbMax(this,this->m_curNodeIndex,&this->m_bvhAabbMin);
    if (startIndex < endIndex) {
      iVar16 = startIndex;
      do {
        iVar12 = this->m_curNodeIndex;
        local_40 = getAabbMin(this,iVar16);
        local_50 = getAabbMax(this,iVar16);
        mergeInternalNodeAabb(this,iVar12,&local_40,&local_50);
        iVar16 = iVar16 + 1;
      } while (endIndex != iVar16);
    }
    iVar12 = this->m_curNodeIndex + 1;
    this->m_curNodeIndex = iVar12;
    buildTree(this,startIndex,endIndex_00);
    iVar16 = this->m_curNodeIndex;
    buildTree(this,endIndex_00,endIndex);
    iVar15 = this->m_curNodeIndex - iVar15;
    bVar9 = this->m_useQuantization;
    if (((bool)bVar9 == true) && (0x80 < iVar15)) {
      updateSubtreeHeaders(this,iVar12,iVar16);
      bVar9 = this->m_useQuantization;
    }
    if ((bVar9 & 1) == 0) {
      (this->m_contiguousNodes).m_data[iVar10].m_escapeIndex = iVar15;
    }
    else {
      (this->m_quantizedContiguousNodes).m_data[iVar10].m_escapeIndexOrTriangleIndex = -iVar15;
    }
  }
  return;
}

Assistant:

void	btQuantizedBvh::buildTree	(int startIndex,int endIndex)
{
#ifdef DEBUG_TREE_BUILDING
	gStackDepth++;
	if (gStackDepth > gMaxStackDepth)
		gMaxStackDepth = gStackDepth;
#endif //DEBUG_TREE_BUILDING


	int splitAxis, splitIndex, i;
	int numIndices =endIndex-startIndex;
	int curIndex = m_curNodeIndex;

	btAssert(numIndices>0);

	if (numIndices==1)
	{
#ifdef DEBUG_TREE_BUILDING
		gStackDepth--;
#endif //DEBUG_TREE_BUILDING
		
		assignInternalNodeFromLeafNode(m_curNodeIndex,startIndex);

		m_curNodeIndex++;
		return;	
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.
	
	splitAxis = calcSplittingAxis(startIndex,endIndex);

	splitIndex = sortAndCalcSplittingIndex(startIndex,endIndex,splitAxis);

	int internalNodeIndex = m_curNodeIndex;
	
	//set the min aabb to 'inf' or a max value, and set the max aabb to a -inf/minimum value.
	//the aabb will be expanded during buildTree/mergeInternalNodeAabb with actual node values
	setInternalNodeAabbMin(m_curNodeIndex,m_bvhAabbMax);//can't use btVector3(SIMD_INFINITY,SIMD_INFINITY,SIMD_INFINITY)) because of quantization
	setInternalNodeAabbMax(m_curNodeIndex,m_bvhAabbMin);//can't use btVector3(-SIMD_INFINITY,-SIMD_INFINITY,-SIMD_INFINITY)) because of quantization
	
	
	for (i=startIndex;i<endIndex;i++)
	{
		mergeInternalNodeAabb(m_curNodeIndex,getAabbMin(i),getAabbMax(i));
	}

	m_curNodeIndex++;
	

	//internalNode->m_escapeIndex;
	
	int leftChildNodexIndex = m_curNodeIndex;

	//build left child tree
	buildTree(startIndex,splitIndex);

	int rightChildNodexIndex = m_curNodeIndex;
	//build right child tree
	buildTree(splitIndex,endIndex);

#ifdef DEBUG_TREE_BUILDING
	gStackDepth--;
#endif //DEBUG_TREE_BUILDING

	int escapeIndex = m_curNodeIndex - curIndex;

	if (m_useQuantization)
	{
		//escapeIndex is the number of nodes of this subtree
		const int sizeQuantizedNode =sizeof(btQuantizedBvhNode);
		const int treeSizeInBytes = escapeIndex * sizeQuantizedNode;
		if (treeSizeInBytes > MAX_SUBTREE_SIZE_IN_BYTES)
		{
			updateSubtreeHeaders(leftChildNodexIndex,rightChildNodexIndex);
		}
	} else
	{

	}

	setInternalNodeEscapeIndex(internalNodeIndex,escapeIndex);

}